

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int rebuildPage(CellArray *pCArray,int iFirst,int nCell,MemPage *pPg)

{
  uint uVar1;
  u8 *puVar2;
  char *pcVar3;
  ushort *puVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ushort *puVar9;
  long lVar10;
  ulong uVar11;
  ushort *__src;
  ushort *puVar12;
  ulong uVar13;
  long lVar14;
  ushort *local_70;
  
  uVar11 = (ulong)pPg->hdrOffset;
  puVar2 = pPg->aData;
  uVar1 = pPg->pBt->usableSize;
  puVar12 = (ushort *)(puVar2 + (int)uVar1);
  puVar9 = (ushort *)pPg->aCellIdx;
  uVar6 = (uint)(ushort)(*(ushort *)(puVar2 + uVar11 + 5) << 8 |
                        *(ushort *)(puVar2 + uVar11 + 5) >> 8);
  uVar7 = (ulong)uVar6;
  if (uVar1 < uVar6) {
    uVar7 = 0;
  }
  pcVar3 = pPg->pBt->pPager->pTmpSpace;
  memcpy(pcVar3 + uVar7,puVar2 + uVar7,(ulong)(uVar1 - (int)uVar7));
  uVar8 = 0;
  do {
    uVar13 = uVar8;
    if (5 < uVar13) break;
    uVar8 = uVar13 + 1;
  } while (pCArray->ixNx[uVar13] <= iFirst);
  lVar10 = (long)iFirst;
  local_70 = puVar12;
  do {
    puVar4 = (ushort *)pCArray->apEnd[uVar13];
    do {
      __src = (ushort *)pCArray->apCell[lVar10];
      uVar8 = (ulong)pCArray->szCell[lVar10];
      if ((__src < puVar2 + uVar7) || (puVar12 <= __src)) {
        if ((__src < puVar4) && (puVar4 < (ushort *)((long)__src + uVar8))) {
          iVar5 = 0x12680;
          goto LAB_001761e1;
        }
      }
      else {
        if (puVar12 < (ushort *)((long)__src + uVar8)) {
          iVar5 = 0x1267b;
          goto LAB_001761e1;
        }
        __src = (ushort *)((long)__src + ((long)pcVar3 - (long)puVar2));
      }
      local_70 = (ushort *)((long)local_70 - uVar8);
      lVar14 = (long)local_70 - (long)puVar2;
      *puVar9 = (ushort)lVar14 << 8 | (ushort)lVar14 >> 8;
      puVar9 = puVar9 + 1;
      if (local_70 < puVar9) {
        iVar5 = 0x12686;
LAB_001761e1:
        iVar5 = sqlite3CorruptError(iVar5);
        return iVar5;
      }
      memmove(local_70,__src,uVar8);
      lVar10 = lVar10 + 1;
      if (nCell + iFirst <= lVar10) {
        pPg->nCell = (u16)nCell;
        pPg->nOverflow = '\0';
        (puVar2 + uVar11 + 1)[0] = '\0';
        (puVar2 + uVar11 + 1)[1] = '\0';
        puVar2[uVar11 + 3] = *(u8 *)((long)&pPg->nCell + 1);
        puVar2[uVar11 + 4] = (u8)pPg->nCell;
        puVar2[uVar11 + 5] = (u8)((ulong)lVar14 >> 8);
        puVar2[uVar11 + 6] = (u8)lVar14;
        puVar2[uVar11 + 7] = '\0';
        return 0;
      }
    } while (lVar10 < pCArray->ixNx[(int)uVar13]);
    uVar13 = (ulong)((int)uVar13 + 1);
  } while( true );
}

Assistant:

static int rebuildPage(
  CellArray *pCArray,             /* Content to be added to page pPg */
  int iFirst,                     /* First cell in pCArray to use */
  int nCell,                      /* Final number of cells on page */
  MemPage *pPg                    /* The page to be reconstructed */
){
  const int hdr = pPg->hdrOffset;          /* Offset of header on pPg */
  u8 * const aData = pPg->aData;           /* Pointer to data for pPg */
  const int usableSize = pPg->pBt->usableSize;
  u8 * const pEnd = &aData[usableSize];
  int i = iFirst;                 /* Which cell to copy from pCArray*/
  u32 j;                          /* Start of cell content area */
  int iEnd = i+nCell;             /* Loop terminator */
  u8 *pCellptr = pPg->aCellIdx;
  u8 *pTmp = sqlite3PagerTempSpace(pPg->pBt->pPager);
  u8 *pData;
  int k;                          /* Current slot in pCArray->apEnd[] */
  u8 *pSrcEnd;                    /* Current pCArray->apEnd[k] value */

  assert( i<iEnd );
  j = get2byte(&aData[hdr+5]);
  if( j>(u32)usableSize ){ j = 0; }
  memcpy(&pTmp[j], &aData[j], usableSize - j);

  for(k=0; pCArray->ixNx[k]<=i && ALWAYS(k<NB*2); k++){}
  pSrcEnd = pCArray->apEnd[k];

  pData = pEnd;
  while( 1/*exit by break*/ ){
    u8 *pCell = pCArray->apCell[i];
    u16 sz = pCArray->szCell[i];
    assert( sz>0 );
    if( SQLITE_WITHIN(pCell,aData+j,pEnd) ){
      if( ((uptr)(pCell+sz))>(uptr)pEnd ) return SQLITE_CORRUPT_BKPT;
      pCell = &pTmp[pCell - aData];
    }else if( (uptr)(pCell+sz)>(uptr)pSrcEnd
           && (uptr)(pCell)<(uptr)pSrcEnd
    ){
      return SQLITE_CORRUPT_BKPT;
    }

    pData -= sz;
    put2byte(pCellptr, (pData - aData));
    pCellptr += 2;
    if( pData < pCellptr ) return SQLITE_CORRUPT_BKPT;
    memmove(pData, pCell, sz);
    assert( sz==pPg->xCellSize(pPg, pCell) || CORRUPT_DB );
    i++;
    if( i>=iEnd ) break;
    if( pCArray->ixNx[k]<=i ){
      k++;
      pSrcEnd = pCArray->apEnd[k];
    }
  }

  /* The pPg->nFree field is now set incorrectly. The caller will fix it. */
  pPg->nCell = nCell;
  pPg->nOverflow = 0;

  put2byte(&aData[hdr+1], 0);
  put2byte(&aData[hdr+3], pPg->nCell);
  put2byte(&aData[hdr+5], pData - aData);
  aData[hdr+7] = 0x00;
  return SQLITE_OK;
}